

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

int __thiscall CVmDynFuncVMIfc::validate_pool_list(CVmDynFuncVMIfc *this,uint32_t ofs)

{
  int iVar1;
  pool_ofs_t in_ESI;
  CVmPoolInMem *in_RDI;
  size_t len;
  char *p;
  size_t local_28;
  char *local_20;
  pool_ofs_t in_stack_fffffffffffffffc;
  
  iVar1 = CVmPoolInMem::validate_ofs((CVmPoolInMem *)len,in_stack_fffffffffffffffc);
  if ((iVar1 == 0) ||
     (iVar1 = CVmPoolInMem::validate_ofs((CVmPoolInMem *)len,in_stack_fffffffffffffffc), iVar1 == 0)
     ) {
    iVar1 = 0;
  }
  else {
    local_20 = CVmPoolInMem::get_ptr(in_RDI,in_ESI);
    local_28 = vmb_get_len((char *)0x330846);
    local_20 = local_20 + 2;
    iVar1 = CVmPoolInMem::validate_ofs((CVmPoolInMem *)len,in_stack_fffffffffffffffc);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      for (; local_28 != 0; local_28 = local_28 - 1) {
        if ((*local_20 < '\0') || ('\x12' < *local_20)) {
          return 0;
        }
        local_20 = local_20 + 5;
      }
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

virtual int validate_pool_list(uint32_t ofs)
    {
        /* establish globals */
        VMGLOB_PTR(vmg);

        /* validate the starting offset and full length prefix */
        if (!G_const_pool->validate_ofs(ofs)
            || !G_const_pool->validate_ofs(ofs+1))
            return FALSE;

        /* get the length */
        const char *p = G_const_pool->get_ptr(ofs);
        size_t len = vmb_get_len(p);
        p += VMB_LEN;

        /* make sure the end of the string is valid as well */
        if (!G_const_pool->validate_ofs(
            ofs + VMB_LEN + (len*VMB_DATAHOLDER) - 1))
            return FALSE;

        /* validate that each element is valid */
        for ( ; len != 0 ; p += VMB_DATAHOLDER, --len)
        {
            if (*p < 0 || *p >= (int)VM_FIRST_INVALID_TYPE)
                return FALSE;
        }

        /* success */
        return TRUE;
    }